

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET name_to_frame_format(char *name,MppFrameFormat *fmt)

{
  int iVar1;
  Ext2FrmFmt *info;
  char ext [50];
  uint local_1c;
  MPP_RET ret;
  RK_U32 i;
  MppFrameFormat *fmt_local;
  char *name_local;
  
  stack0xffffffffffffffe0 = MPP_NOK;
  get_extension(name,(char *)&info);
  for (local_1c = 0; local_1c < 0x11; local_1c = local_1c + 1) {
    iVar1 = strcmp((char *)&info,map_ext_to_frm_fmt[local_1c].ext_name);
    if (iVar1 == 0) {
      *fmt = map_ext_to_frm_fmt[local_1c].format;
      stack0xffffffffffffffe0 = MPP_OK;
    }
  }
  return stack0xffffffffffffffe0;
}

Assistant:

MPP_RET name_to_frame_format(const char *name, MppFrameFormat *fmt)
{
    RK_U32 i;
    MPP_RET ret = MPP_NOK;
    char ext[50];

    get_extension(name, ext);

    for (i = 0; i < MPP_ARRAY_ELEMS(map_ext_to_frm_fmt); i++) {
        Ext2FrmFmt *info = &map_ext_to_frm_fmt[i];

        if (!strcmp(ext, info->ext_name)) {
            *fmt = info->format;
            ret = MPP_OK;
        }
    }

    return ret;
}